

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Client __thiscall
capnp::reverseMembrane(capnp *this,Client *inner,Own<capnp::MembranePolicy> *policy)

{
  ClientHook *pCVar1;
  ClientHook *pCVar2;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> OVar3;
  Client CVar4;
  Own<capnp::ClientHook> local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28.disposer = (inner->hook).disposer;
  local_28.ptr = (inner->hook).ptr;
  (inner->hook).ptr = (ClientHook *)0x0;
  OVar3 = anon_unknown_0::membrane((anon_unknown_0 *)&local_18,&local_28,policy->ptr,true);
  pCVar1 = local_28.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined8 *)this = local_18;
  *(undefined8 *)(this + 8) = local_10;
  local_10 = 0;
  if (local_28.ptr != (ClientHook *)0x0) {
    local_28.ptr = (ClientHook *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
    pCVar2 = extraout_RDX;
  }
  CVar4.hook.ptr = pCVar2;
  CVar4.hook.disposer = (Disposer *)this;
  return (Client)CVar4.hook;
}

Assistant:

Capability::Client reverseMembrane(Capability::Client inner, kj::Own<MembranePolicy> policy) {
  return Capability::Client(membrane(
      ClientHook::from(kj::mv(inner)), *policy, true));
}